

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

int64_t icu_63::util64_fromDouble(double d)

{
  UBool UVar1;
  int64_t iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  UVar1 = uprv_isNaN_63(d);
  if (UVar1 == '\0') {
    dVar3 = uprv_maxMantissa_63();
    dVar5 = -dVar3;
    if ((dVar5 <= d) && (dVar5 = d, dVar3 < d)) {
      dVar5 = dVar3;
    }
    dVar4 = -dVar5;
    dVar3 = dVar4;
    if (dVar4 <= dVar5) {
      dVar3 = dVar5;
    }
    dVar3 = uprv_floor_63(dVar3);
    iVar2 = -(long)dVar3;
    if (dVar4 <= dVar5) {
      iVar2 = (long)dVar3;
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int64_t util64_fromDouble(double d) {
    int64_t result = 0;
    if (!uprv_isNaN(d)) {
        double mant = uprv_maxMantissa();
        if (d < -mant) {
            d = -mant;
        } else if (d > mant) {
            d = mant;
        }
        UBool neg = d < 0; 
        if (neg) {
            d = -d;
        }
        result = (int64_t)uprv_floor(d);
        if (neg) {
            result = -result;
        }
    }
    return result;
}